

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O1

StepStatus __thiscall
adiosStream::readADIOS
          (adiosStream *this,CommandRead *cmdR,Config *cfg,Settings *settings,size_t step)

{
  Engine *pEVar1;
  undefined8 *puVar2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong *puVar15;
  long *plVar16;
  pointer psVar17;
  char cVar18;
  undefined8 uVar19;
  uint __len;
  shared_ptr<VariableInfo> *v;
  ulong uVar20;
  int totalRanks;
  Settings *local_198;
  int myRank;
  StepStatus local_18c;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  string __str_1;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  shared_ptr<VariableInfo> local_e8;
  size_t local_d8;
  Engine *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string __str;
  vector<double,_std::allocator<double>_> readtime_all_ranks;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  varmap;
  _Rb_tree_node_base local_68;
  double local_40;
  double readTime;
  
  local_198 = settings;
  local_d8 = step;
  if ((settings->myRank == 0) && (settings->verbose != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Read ",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(cmdR->streamName)._M_dataplus._M_p,
                        (cmdR->streamName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," with timeout value ",0x14);
    poVar9 = std::ostream::_M_insert<double>((double)cmdR->timeout_sec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," using the group ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,(cmdR->groupName)._M_dataplus._M_p,(cmdR->groupName)._M_string_length);
    if ((cmdR->variables).
        super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (cmdR->variables).
        super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," with selected variables:  ",0x1b);
      psVar3 = (cmdR->variables).
               super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar17 = (cmdR->variables).
                     super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar3;
          psVar17 = psVar17 + 1) {
        peVar4 = (psVar17->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(peVar4->name)._M_dataplus._M_p,
                            (peVar4->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  MPI_Barrier(this->comm);
  local_40 = (double)MPI_Wtime();
  pEVar1 = &this->engine;
  local_18c = adios2::Engine::BeginStep((StepMode)pEVar1,cmdR->timeout_sec);
  if (local_18c == OK) {
    if (((local_198->myRank == 0) && (local_d8 == 1)) && (local_198->verbose != 0)) {
      adios2::IO::AvailableVariables_abi_cxx11_(SUB81(&varmap,0));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"    Variables in input for reading: ",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      p_Var10 = local_68._M_left;
      if (local_68._M_left != &local_68) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        ",8);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)(p_Var10 + 1),
                              (long)p_Var10[1]._M_parent);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != &local_68);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)&varmap);
    }
    local_d0 = pEVar1;
    if ((local_198->myRank == 0) && (local_198->verbose != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Read data ",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
    }
    psVar17 = (cmdR->variables).
              super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (cmdR->variables).
             super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar17 != psVar3) {
      do {
        local_e8.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (psVar17->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (psVar17->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
        }
        local_e8.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_00;
        getADIOSArray(this,&local_e8);
        if (local_e8.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar17 = psVar17 + 1;
      } while (psVar17 != psVar3);
    }
    if ((local_d8 == 1) && (local_198->fixedPattern == true)) {
      if ((local_198->myRank == 0) && (local_198->verbose != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "        Lock Reader Selections for Fixed Pattern before first EndStep",0x45);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
      }
      adios2::Engine::LockWriterDefinitions();
    }
    adios2::Engine::EndStep();
    local_198 = (Settings *)MPI_Wtime();
    MPI_Comm_rank(this->comm,&myRank);
    MPI_Comm_size(this->comm,&totalRanks);
    if (this->hasIOTimer == true) {
      readTime = (double)local_198 - local_40;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (myRank == 0) {
        std::vector<double,_std::allocator<double>_>::reserve(&readtime_all_ranks,(long)totalRanks);
      }
      MPI_Gather(&readTime,1,&ompi_mpi_double,
                 readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,1,&ompi_mpi_double,0,this->comm);
      if ((myRank == 0) && (0 < totalRanks)) {
        uVar20 = 0;
        do {
          uVar11 = adios2::Engine::CurrentStep();
          cVar18 = '\x01';
          if (9 < uVar11) {
            uVar14 = uVar11;
            cVar7 = '\x04';
            do {
              cVar18 = cVar7;
              if (uVar14 < 100) {
                cVar18 = cVar18 + -2;
                goto LAB_001168e1;
              }
              if (uVar14 < 1000) {
                cVar18 = cVar18 + -1;
                goto LAB_001168e1;
              }
              if (uVar14 < 10000) goto LAB_001168e1;
              bVar5 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              cVar7 = cVar18 + '\x04';
            } while (bVar5);
            cVar18 = cVar18 + '\x01';
          }
LAB_001168e1:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str,cVar18);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar11);
          plVar12 = (long *)std::__cxx11::string::append((char *)&__str);
          local_128 = &local_118;
          puVar15 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar15) {
            local_118 = *puVar15;
            lStack_110 = plVar12[3];
          }
          else {
            local_118 = *puVar15;
            local_128 = (ulong *)*plVar12;
          }
          local_120 = plVar12[1];
          *plVar12 = (long)puVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          __len = 1;
          if (9 < uVar20) {
            uVar6 = 4;
            uVar11 = uVar20;
            do {
              __len = uVar6;
              uVar8 = (uint)uVar11;
              if (uVar8 < 100) {
                __len = __len - 2;
                goto LAB_001169ca;
              }
              if (uVar8 < 1000) {
                __len = __len - 1;
                goto LAB_001169ca;
              }
              if (uVar8 < 10000) goto LAB_001169ca;
              uVar11 = (uVar11 & 0xffffffff) / 10000;
              uVar6 = __len + 4;
            } while (99999 < uVar8);
            __len = __len + 1;
          }
LAB_001169ca:
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_1,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (__str_1._M_dataplus._M_p,__len,(uint)uVar20);
          uVar11 = 0xf;
          if (local_128 != &local_118) {
            uVar11 = local_118;
          }
          if (uVar11 < __str_1._M_string_length + local_120) {
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
              uVar19 = __str_1.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < __str_1._M_string_length + local_120) goto LAB_00116a51;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,(ulong)local_128);
          }
          else {
LAB_00116a51:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_128,(ulong)__str_1._M_dataplus._M_p);
          }
          local_188 = &local_178;
          puVar2 = puVar13 + 2;
          if ((undefined8 *)*puVar13 == puVar2) {
            local_178 = *puVar2;
            uStack_170 = puVar13[3];
          }
          else {
            local_178 = *puVar2;
            local_188 = (undefined8 *)*puVar13;
          }
          local_180 = puVar13[1];
          *puVar13 = puVar2;
          puVar13[1] = 0;
          *(undefined1 *)puVar2 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_108 = &local_f8;
          puVar15 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar15) {
            local_f8 = *puVar15;
            lStack_f0 = plVar12[3];
          }
          else {
            local_f8 = *puVar15;
            local_108 = (ulong *)*plVar12;
          }
          local_100 = plVar12[1];
          *plVar12 = (long)puVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_c8,vsnprintf,0x148,"%f",
                     SUB84(readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar20],0));
          uVar11 = 0xf;
          if (local_108 != &local_f8) {
            uVar11 = local_f8;
          }
          if (uVar11 < local_c8._M_string_length + local_100) {
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              uVar19 = local_c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_c8._M_string_length + local_100) goto LAB_00116bb4;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_108)
            ;
          }
          else {
LAB_00116bb4:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_108,(ulong)local_c8._M_dataplus._M_p);
          }
          local_168 = &local_158;
          puVar2 = puVar13 + 2;
          if ((undefined8 *)*puVar13 == puVar2) {
            local_158 = *puVar2;
            uStack_150 = puVar13[3];
          }
          else {
            local_158 = *puVar2;
            local_168 = (undefined8 *)*puVar13;
          }
          local_160 = puVar13[1];
          *puVar13 = puVar2;
          puVar13[1] = 0;
          *(undefined1 *)puVar2 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_168);
          _varmap = &local_68._M_parent;
          plVar16 = plVar12 + 2;
          if ((_Base_ptr *)*plVar12 == (_Base_ptr *)plVar16) {
            local_68._M_parent = (_Base_ptr)*plVar16;
            local_68._M_left = (_Base_ptr)plVar12[3];
          }
          else {
            local_68._M_parent = (_Base_ptr)*plVar16;
            _varmap = (_Base_ptr *)*plVar12;
          }
          local_68._0_8_ = plVar12[1];
          *plVar12 = (long)plVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          if (local_168 != &local_158) {
            operator_delete(local_168);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
            operator_delete(__str_1._M_dataplus._M_p);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          fputs((char *)_varmap,(FILE *)this->perfLogFP);
          if (_varmap != &local_68._M_parent) {
            operator_delete(_varmap);
          }
          uVar20 = uVar20 + 1;
        } while ((long)uVar20 < (long)totalRanks);
      }
      if (readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return local_18c;
}

Assistant:

adios2::StepStatus adiosStream::readADIOS(CommandRead *cmdR, Config &cfg, const Settings &settings,
                                          size_t step)
{
    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read " << cmdR->streamName << " with timeout value " << cmdR->timeout_sec
                  << " using the group " << cmdR->groupName;
        if (!cmdR->variables.empty())
        {
            std::cout << " with selected variables:  ";
            for (const auto &v : cmdR->variables)
            {
                std::cout << v->name << " ";
            }
        }
        std::cout << "... " << std::endl;
    }
    double timeStart, timeEnd;
    double readTime;
    // double maxReadTime, minReadTime;
    MPI_Barrier(comm);
    timeStart = MPI_Wtime();
    adios2::StepStatus status = engine.BeginStep(cmdR->stepMode, cmdR->timeout_sec);
    if (status != adios2::StepStatus::OK)
    {
        return status;
    }

    if (!settings.myRank && settings.verbose && step == 1)
    {
        const auto varmap = io.AvailableVariables();
        std::cout << "    Variables in input for reading: " << std::endl;
        for (const auto &v : varmap)
        {
            std::cout << "        " << v.first << std::endl;
        }
    }

    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read data " << std::endl;
    }

    for (auto ov : cmdR->variables)
    {
        getADIOSArray(ov);
    }

    if (step == 1 && settings.fixedPattern)
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "        Lock Reader Selections for Fixed Pattern before "
                         "first EndStep"
                      << std::endl;
        }
        engine.LockWriterDefinitions();
    }

    engine.EndStep();
    timeEnd = MPI_Wtime();
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    if (hasIOTimer)
    {
        readTime = timeEnd - timeStart;
        // double *writetime_all_ranks = NULL;
        std::vector<double> readtime_all_ranks;
        if (myRank == 0)
        {
            // writetime_all_ranks = (double *)malloc(totalRanks);
            //	if (!writetime_all_ranks)
            //	{
            //	    std::cout << "rank " << myRank << ": malloc failed!" <<
            // std::endl;
            //	}
            //	else
            //	{
            //	    std::cout << "rank " << myRank << ": malloc succeeded!" <<
            // std::endl;
            //	}
            readtime_all_ranks.reserve(totalRanks);
        }

        MPI_Gather(&readTime, 1, MPI_DOUBLE, readtime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",read," +
                                      std::to_string(readtime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }

    // for (auto ov : cmdR->variables)
    // {
    //     if (settings.myRank == 1)
    //     {
    //         size_t varsize = std::accumulate(ov->count.begin(),
    //         ov->count.end(), 1,
    //                             std::multiplies<std::size_t>());
    //         std::cout << ov->name << ", " << varsize << std::endl;
    //         const double *dd = reinterpret_cast<double *>(ov->data.data());
    //         for (int j = 0; j < varsize; j++)
    //             std::cout << dd[j] << ", ";
    //         std::cout << std::endl;
    //     }
    // }
    return status;
}